

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_hw1.c
# Opt level: O3

uint32_t crc32c(void *buf,size_t len,uint32_t crc)

{
  ulong uVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  size_t sVar5;
  undefined8 *puVar6;
  ulong uVar7;
  
  pthread_once(&crc32c_once_hw,crc32c_init_hw);
  uVar7 = (ulong)~crc;
  if (((ulong)buf & 7) != 0 && len != 0) {
    uVar1 = (long)buf + 1;
    sVar5 = len;
    do {
      uVar7 = crc32(uVar7,*buf);
      buf = (void *)((long)buf + 1);
      len = sVar5 - 1;
      if (sVar5 == 1) break;
      uVar4 = uVar1 & 7;
      uVar1 = uVar1 + 1;
      sVar5 = len;
    } while (uVar4 != 0);
  }
  for (; 0x5fff < len; len = len - 0x6000) {
    uVar4 = 0xfffffffffffffff8;
    uVar3 = 0;
    uVar1 = 0;
    do {
      puVar6 = (undefined8 *)(uVar4 + 8 + (long)buf);
      uVar4 = uVar4 + 8;
      uVar7 = crc32(uVar7,*puVar6);
      uVar3 = crc32(uVar3,puVar6[0x400]);
      uVar1 = crc32(uVar1,puVar6[0x800]);
    } while (uVar4 < 0x1ff8);
    uVar2 = (uint)uVar7;
    buf = (void *)((long)buf + 0x6000);
    uVar2 = (uint)uVar3 ^ crc32c_long[0][uVar2 & 0xff] ^ crc32c_long[1][(uint)(uVar7 >> 8) & 0xff] ^
            crc32c_long[2][uVar2 >> 0x10 & 0xff] ^ crc32c_long[3][uVar2 >> 0x18];
    uVar7 = uVar1 ^ (crc32c_long[1][uVar2 >> 8 & 0xff] ^ crc32c_long[0][uVar2 & 0xff] ^
                     crc32c_long[2][uVar2 >> 0x10 & 0xff] ^ crc32c_long[3][uVar2 >> 0x18]);
  }
  for (; 0x2ff < len; len = len - 0x300) {
    uVar4 = 0xfffffffffffffff8;
    uVar3 = 0;
    uVar1 = 0;
    do {
      puVar6 = (undefined8 *)(uVar4 + 8 + (long)buf);
      uVar4 = uVar4 + 8;
      uVar7 = crc32(uVar7,*puVar6);
      uVar3 = crc32(uVar3,puVar6[0x20]);
      uVar1 = crc32(uVar1,puVar6[0x40]);
    } while (uVar4 < 0xf8);
    uVar2 = (uint)uVar7;
    buf = (void *)((long)buf + 0x300);
    uVar2 = (uint)uVar3 ^ crc32c_short[0][uVar2 & 0xff] ^ crc32c_short[1][(uint)(uVar7 >> 8) & 0xff]
            ^ crc32c_short[2][uVar2 >> 0x10 & 0xff] ^ crc32c_short[3][uVar2 >> 0x18];
    uVar7 = uVar1 ^ (crc32c_short[1][uVar2 >> 8 & 0xff] ^ crc32c_short[0][uVar2 & 0xff] ^
                     crc32c_short[2][uVar2 >> 0x10 & 0xff] ^ crc32c_short[3][uVar2 >> 0x18]);
  }
  uVar1 = (ulong)((uint)len & 7);
  if ((len & 0x3f8) != 0) {
    puVar6 = (undefined8 *)((ulong)((uint)len & 0x3f8) + (long)buf);
    do {
      uVar7 = crc32(uVar7,*buf);
      buf = (void *)((long)buf + 8);
    } while (buf < puVar6);
  }
  for (; uVar1 != 0; uVar1 = uVar1 - 1) {
    uVar7 = crc32(uVar7,*buf);
    buf = (void *)((long)buf + 1);
  }
  return ~(uint)uVar7;
}

Assistant:

uint32_t crc32c(const void *buf, size_t len, uint32_t crc)
{
    const unsigned char *next = buf;
    const unsigned char *end;
    uint64_t crc0, crc1, crc2;      /* need to be 64 bits for crc32q */

    /* populate shift tables the first time through */
    pthread_once(&crc32c_once_hw, crc32c_init_hw);

    /* pre-process the crc */
    crc0 = crc ^ 0xffffffff;

    /* compute the crc for up to seven leading bytes to bring the data pointer
       to an eight-byte boundary */
    while (len && ((uintptr_t)next & 7) != 0) {
        __asm__("crc32b\t" "(%1), %0"
                : "=r"(crc0)
                : "r"(next), "0"(crc0));
        next++;
        len--;
    }

    /* compute the crc on sets of LONG*3 bytes, executing three independent crc
       instructions, each on LONG bytes -- this is optimized for the Nehalem,
       Westmere, Sandy Bridge, and Ivy Bridge architectures, which have a
       throughput of one crc per cycle, but a latency of three cycles */
    while (len >= LONG*3) {
        crc1 = 0;
        crc2 = 0;
        end = next + LONG;
        do {
            __asm__("crc32q\t" "(%3), %0\n\t"
                    "crc32q\t" LONGx1 "(%3), %1\n\t"
                    "crc32q\t" LONGx2 "(%3), %2"
                    : "=r"(crc0), "=r"(crc1), "=r"(crc2)
                    : "r"(next), "0"(crc0), "1"(crc1), "2"(crc2));
            next += 8;
        } while (next < end);
        crc0 = crc32c_shift(crc32c_long, crc0) ^ crc1;
        crc0 = crc32c_shift(crc32c_long, crc0) ^ crc2;
        next += LONG*2;
        len -= LONG*3;
    }

    /* do the same thing, but now on SHORT*3 blocks for the remaining data less
       than a LONG*3 block */
    while (len >= SHORT*3) {
        crc1 = 0;
        crc2 = 0;
        end = next + SHORT;
        do {
            __asm__("crc32q\t" "(%3), %0\n\t"
                    "crc32q\t" SHORTx1 "(%3), %1\n\t"
                    "crc32q\t" SHORTx2 "(%3), %2"
                    : "=r"(crc0), "=r"(crc1), "=r"(crc2)
                    : "r"(next), "0"(crc0), "1"(crc1), "2"(crc2));
            next += 8;
        } while (next < end);
        crc0 = crc32c_shift(crc32c_short, crc0) ^ crc1;
        crc0 = crc32c_shift(crc32c_short, crc0) ^ crc2;
        next += SHORT*2;
        len -= SHORT*3;
    }

    /* compute the crc on the remaining eight-byte units less than a SHORT*3
       block */
    end = next + (len - (len & 7));
    while (next < end) {
        __asm__("crc32q\t" "(%1), %0"
                : "=r"(crc0)
                : "r"(next), "0"(crc0));
        next += 8;
    }
    len &= 7;

    /* compute the crc for up to seven trailing bytes */
    while (len) {
        __asm__("crc32b\t" "(%1), %0"
                : "=r"(crc0)
                : "r"(next), "0"(crc0));
        next++;
        len--;
    }

    /* return a post-processed crc */
    return (uint32_t)(crc0 ^ 0xffffffff);
}